

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

Abc_Cex_t * Bmcs_ManGenerateCex(Bmcs_Man_t *p,int i,int f,int s)

{
  int *piVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  int nTruePos;
  long lVar7;
  long lVar8;
  
  pGVar4 = p->pGia;
  iVar2 = pGVar4->nRegs;
  nTruePos = pGVar4->vCos->nSize - iVar2;
  pAVar3 = Abc_CexMakeTriv(iVar2,pGVar4->vCis->nSize - iVar2,nTruePos,f * nTruePos + i);
  pGVar4 = p->pFrames;
  pVVar5 = pGVar4->vCis;
  uVar6 = (ulong)(uint)pVVar5->nSize;
  if (pGVar4->nRegs < pVVar5->nSize) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      if ((int)uVar6 <= lVar8) {
LAB_005704be:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar5->pArray + lVar7 * 2);
      if (((long)iVar2 < 0) || (pGVar4->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar3;
      }
      if ((p->vFr2Sat).nSize <= iVar2) goto LAB_005704be;
      iVar2 = (p->vFr2Sat).pArray[iVar2];
      if ((0 < iVar2) && (iVar2 = satoko_read_cex_varvalue(p->pSats[s],iVar2), iVar2 != 0)) {
        iVar2 = (p->vCiMap).nSize;
        if ((iVar2 <= (int)lVar7) || (iVar2 <= (int)lVar7 + 1)) goto LAB_005704be;
        piVar1 = (p->vCiMap).pArray;
        iVar2 = p->pGia->nRegs;
        iVar2 = iVar2 + piVar1[lVar7] + (p->pGia->vCis->nSize - iVar2) * piVar1[lVar7 + 1];
        (&pAVar3[1].iPo)[iVar2 >> 5] = (&pAVar3[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
      }
      lVar8 = lVar8 + 1;
      pGVar4 = p->pFrames;
      pVVar5 = pGVar4->vCis;
      uVar6 = (ulong)pVVar5->nSize;
      lVar7 = lVar7 + 2;
    } while (lVar8 < (long)(uVar6 - (long)pGVar4->nRegs));
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Bmcs_ManGenerateCex( Bmcs_Man_t * p, int i, int f, int s )
{
    Abc_Cex_t * pCex = Abc_CexMakeTriv( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), Gia_ManPoNum(p->pGia), f*Gia_ManPoNum(p->pGia)+i );
    Gia_Obj_t * pObj;  int k;
    Gia_ManForEachPi( p->pFrames, pObj, k )
    {
        int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
        if ( iSatVar > 0 && bmc_sat_solver_read_cex_varvalue(p->pSats[s], iSatVar) ) // 1 bit
        {
            int iCiId   = Vec_IntEntry( &p->vCiMap, 2*k+0 );
            int iFrame  = Vec_IntEntry( &p->vCiMap, 2*k+1 );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pGia) + iFrame * Gia_ManPiNum(p->pGia) + iCiId );
        }
    }
    return pCex;
}